

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

bool __thiscall
RealtimeHelper::playMIDIShortMessageRealtime(RealtimeHelper *this,Bit32u msg,quint64 timestamp)

{
  QMutex *pQVar1;
  QSynth *pQVar2;
  Synth *this_00;
  bool bVar3;
  bool bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  pQVar1 = this->qsynth->midiMutex;
  bVar3 = false;
  LOCK();
  bVar4 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
  if (bVar4) {
    (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (bVar4) {
    pQVar2 = this->qsynth;
    if (pQVar2->state == SynthState_OPEN) {
      this_00 = pQVar2->synth;
      auVar6._8_4_ = (int)(timestamp >> 0x20);
      auVar6._0_8_ = timestamp;
      auVar6._12_4_ = 0x45300000;
      dVar5 = MT32Emu::SampleRateConverter::convertOutputToSynthTimestamp
                        (pQVar2->sampleRateConverter,
                         (auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)timestamp) - 4503599627370496.0));
      bVar3 = MT32Emu::Synth::playMsg(this_00,msg,(Bit32u)(long)dVar5);
    }
    else {
      bVar3 = false;
    }
  }
  if (bVar4) {
    LOCK();
    bVar4 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar4) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar4) {
      QBasicMutex::unlockInternal();
    }
  }
  return bVar3;
}

Assistant:

bool playMIDIShortMessageRealtime(Bit32u msg, quint64 timestamp) const {
		RealtimeLocker midiLocker(*qsynth.midiMutex);
		return midiLocker.isLocked() && qsynth.isOpen() && qsynth.synth->playMsg(msg, qsynth.convertOutputToSynthTimestamp(timestamp));
	}